

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderPassBase<Diligent::EngineVkImplTraits>::RenderPassBase
          (RenderPassBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,RenderPassDesc *Desc,bool bIsDeviceInternal)

{
  RenderPassDesc *Desc_00;
  void *ptr;
  STDDeleter<void,_Diligent::IMemoryAllocator> SVar1;
  FixedLinearAllocator MemPool;
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> local_88;
  void *local_80;
  FixedLinearAllocator local_78;
  
  DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
  ).super_ObjectBase<Diligent::IRenderPassVk>.super_RefCountedObject<Diligent::IRenderPassVk>.
  super_IRenderPassVk.super_IRenderPass.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00b00060;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  this->m_AttachmentStates = (RESOURCE_STATE *)0x0;
  this->m_AttachmentFirstLastUse = (pair<unsigned_int,_unsigned_int> *)0x0;
  this->m_IsDestructed = false;
  if (pDevice != (RenderDeviceImplType *)0x0) {
    ValidateRenderPassDesc
              (&(this->
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                ).m_Desc,
               &(pDevice->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo,
               &(pDevice->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo);
  }
  SVar1.m_Allocator = GetRawAllocator();
  local_78.m_ReservedSize = 0;
  local_78.m_CurrAlignment = 0;
  local_78.m_pDataStart = (uint8_t *)0x0;
  local_78.m_pCurrPtr = (uint8_t *)0x0;
  local_78.m_DbgCurrAllocation = 0;
  local_78.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.m_DbgAllocations.
  super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_DbgUsingExternalMemory = false;
  Desc_00 = &(this->
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             ).m_Desc;
  local_78.m_pAllocator = SVar1.m_Allocator;
  ReserveSpace(this,Desc_00,&local_78);
  FixedLinearAllocator::Reserve(&local_78);
  local_78.m_pAllocator = (IMemoryAllocator *)0x0;
  local_80 = (void *)0x0;
  ptr = (this->m_pRawMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = local_78.m_pDataStart;
  local_88._M_head_impl.m_Allocator =
       (STDDeleter<void,_Diligent::IMemoryAllocator>)
       (STDDeleter<void,_Diligent::IMemoryAllocator>)SVar1.m_Allocator;
  if (ptr != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pRawMemory,ptr);
  }
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = local_88._M_head_impl.m_Allocator;
  local_88._M_head_impl.m_Allocator =
       (STDDeleter<void,_Diligent::IMemoryAllocator>)(IMemoryAllocator *)0x0;
  if (local_80 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()(&local_88._M_head_impl,local_80);
  }
  CopyDesc(this,Desc_00,&this->m_AttachmentStates,&this->m_AttachmentFirstLastUse,&local_78);
  FixedLinearAllocator::~FixedLinearAllocator(&local_78);
  return;
}

Assistant:

RenderPassBase(IReferenceCounters*   pRefCounters,
                   RenderDeviceImplType* pDevice,
                   const RenderPassDesc& Desc,
                   bool                  bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        try
        {
            if (pDevice != nullptr)
            {
                ValidateRenderPassDesc(this->m_Desc, pDevice->GetDeviceInfo(), pDevice->GetAdapterInfo());
            }

            IMemoryAllocator&    RawAllocator = GetRawAllocator();
            FixedLinearAllocator MemPool{RawAllocator};
            ReserveSpace(this->m_Desc, MemPool);

            MemPool.Reserve();
            // The memory is now owned by RenderPassBase and will be freed by Destruct().
            m_pRawMemory = decltype(m_pRawMemory){MemPool.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

            CopyDesc(this->m_Desc, m_AttachmentStates, m_AttachmentFirstLastUse, MemPool);
        }
        catch (...)
        {
            Destruct();
            throw;
        }
    }